

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O0

void __thiscall
Qentem::
HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
::Sort(HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
       *this,bool ascend)

{
  SizeT SVar1;
  HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *pHVar2;
  SizeT *pointer;
  SizeT32 size;
  bool ascend_local;
  HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
  *this_local;
  
  if (ascend) {
    pHVar2 = Storage(this);
    SVar1 = Size(this);
    Memory::Sort<true,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              (pHVar2,0,SVar1);
  }
  else {
    pHVar2 = Storage(this);
    SVar1 = Size(this);
    Memory::
    Sort<false,Qentem::HAItem_T<Qentem::String<wchar_t>,Qentem::Value<wchar_t>>,unsigned_int>
              (pHVar2,0,SVar1);
  }
  pointer = getHashTable(this);
  SVar1 = Capacity(this);
  Memory::SetToZero<unsigned_int>(pointer,SVar1 << 2);
  generateHash(this);
  return;
}

Assistant:

void Sort(const bool ascend = true) noexcept {
        constexpr SizeT32 size = sizeof(SizeT);

        if (ascend) {
            Memory::Sort<true>(Storage(), SizeT{0}, Size());
        } else {
            Memory::Sort<false>(Storage(), SizeT{0}, Size());
        }

        Memory::SetToZero(getHashTable(), (size * Capacity()));
        generateHash();
    }